

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall hypermind::Token::dump(Token *this,Ostream *os)

{
  String name;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  switch(this->type) {
  case End:
    break;
  case Delimiter:
    break;
  case Number:
  case Identifier:
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,this->start,this->start + this->length);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  case String:
    goto switchD_0010ac7d_caseD_3;
  case Dot:
    break;
  case Comma:
    break;
  case LeftParen:
    break;
  case RightParen:
    break;
  case LeftBracket:
    break;
  case RightBracket:
    break;
  case LeftBrace:
    break;
  case RightBrace:
    break;
  case Add:
    break;
  case Sub:
    break;
  case Mul:
    break;
  case Div:
    break;
  case Increase:
    break;
  case Decrease:
    break;
  case Assign:
    break;
  case AddAssign:
    break;
  case SubAssign:
    break;
  case MulAssign:
    break;
  case DivAssign:
    break;
  case ModAssign:
    break;
  case AndAssign:
    break;
  case OrAssign:
    break;
  case XorAssign:
    break;
  case Arrow:
    break;
  case Not:
    break;
  case Equal:
    break;
  case NotEqual:
    break;
  case Greater:
    break;
  case Less:
    break;
  case GreaterEqual:
    break;
  case LessEqual:
    break;
  case Or:
    break;
  case LogicOr:
    break;
  case And:
    break;
  case LogicAnd:
    break;
  case Mod:
    break;
  case At:
    break;
  case Colon:
    break;
  default:
    break;
  case KeywordNew:
  }
  std::__cxx11::string::assign((char *)&local_50);
switchD_0010ac7d_caseD_3:
  std::operator<<(os,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Token::dump(Ostream &os) const {
#define TOKEN_DUMP(v) name = _HM_C(v);
        String name;
        switch (type) {
            case TokenType::End:
                TOKEN_DUMP("<end>");
                break;
            case TokenType::Delimiter:
                TOKEN_DUMP("<delimiter>");
                break;
            case TokenType::Add:
                TOKEN_DUMP("+");
                break;
            case TokenType::Sub:
                TOKEN_DUMP("-");
                break;
            case TokenType::Mul:
                TOKEN_DUMP("*");
                break;
            case TokenType::Div:
                TOKEN_DUMP("/");
                break;
            case TokenType::Identifier:
            case TokenType::Number:
                name = String(start, length);
                break;
            case TokenType::String:
                break;
            case TokenType::Dot:
                TOKEN_DUMP(".");
                break;
            case TokenType::Comma:
                TOKEN_DUMP(",");
                break;
            case TokenType::LeftParen:
                TOKEN_DUMP("(");
                break;
            case TokenType::RightParen:
                TOKEN_DUMP(")");
                break;
            case TokenType::LeftBracket:
                TOKEN_DUMP("[");
                break;
            case TokenType::RightBracket:
                TOKEN_DUMP("]");
                break;
            case TokenType::LeftBrace:
                TOKEN_DUMP("{");
                break;
            case TokenType::RightBrace:
                TOKEN_DUMP("}");
                break;
            case TokenType::Increase:
                TOKEN_DUMP("++");
                break;
            case TokenType::Decrease:
                TOKEN_DUMP("--");
                break;
            case TokenType::Assign:
                TOKEN_DUMP("=");
                break;
            case TokenType::AddAssign:
                TOKEN_DUMP("+=");
                break;
            case TokenType::SubAssign:
                TOKEN_DUMP("-=");
                break;
            case TokenType::MulAssign:
                TOKEN_DUMP("*=");
                break;
            case TokenType::DivAssign:
                TOKEN_DUMP("/=");
                break;
            case TokenType::ModAssign:
                TOKEN_DUMP("%=");
                break;
            case TokenType::AndAssign:
                TOKEN_DUMP("&=");
                break;
            case TokenType::OrAssign:
                TOKEN_DUMP("|=");
                break;
            case TokenType::XorAssign:
                TOKEN_DUMP("^=");
                break;
            case TokenType::Arrow:
                TOKEN_DUMP("->");
                break;
            case TokenType::Not:
                TOKEN_DUMP("!");
                break;
            case TokenType::Equal:
                TOKEN_DUMP("==");
                break;
            case TokenType::NotEqual:
                TOKEN_DUMP("!=");
                break;
            case TokenType::Greater:
                TOKEN_DUMP(">");
                break;
            case TokenType::Less:
                TOKEN_DUMP("<");
                break;
            case TokenType::GreaterEqual:
                TOKEN_DUMP(">=");
                break;
            case TokenType::LessEqual:
                TOKEN_DUMP("<=");
                break;
            case TokenType::Or:
                TOKEN_DUMP("|");
                break;
            case TokenType::LogicOr:
                TOKEN_DUMP("||");
                break;
            case TokenType::And:
                TOKEN_DUMP("&");
                break;
            case TokenType::LogicAnd:
                TOKEN_DUMP("&&");
                break;
            case TokenType::Mod:
                TOKEN_DUMP("%");
                break;
            case TokenType::At:
                TOKEN_DUMP("@");
                break;
            case TokenType::Colon:
                TOKEN_DUMP(":");
                break;
            case TokenType::KeywordNew:
                TOKEN_DUMP("new");
                break;
            default:
                TOKEN_DUMP("<unknown>");
        }
        os << name ;
#undef TOKEN_DUMP

    }